

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O0

void __thiscall Kss_Emu::update_gain(Kss_Emu *this)

{
  Music_Emu *in_RDI;
  double dVar1;
  Sms_Apu *this_00;
  double g;
  
  dVar1 = Music_Emu::gain(in_RDI);
  this_00 = (Sms_Apu *)(dVar1 * 1.4);
  if (((ulong)in_RDI[2].effects_buffer & 1) != 0) {
    this_00 = (Sms_Apu *)((double)this_00 * 1.5);
  }
  Ay_Apu::volume((Ay_Apu *)this_00,(double)in_RDI);
  Scc_Apu::volume((Scc_Apu *)this_00,(double)in_RDI);
  if (*(long *)(in_RDI[0xa6].super_Gme_File.playlist_warning + 0x20) != 0) {
    Sms_Apu::volume(this_00,(double)in_RDI);
  }
  return;
}

Assistant:

void Kss_Emu::update_gain()
{
	double g = gain() * 1.4;
	if ( scc_accessed )
		g *= 1.5;
	ay.volume( g );
	scc.volume( g );
	if ( sn )
		sn->volume( g );
}